

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O3

void soplex::SPxQuicksort<soplex::Nonzero<double>,soplex::SPxMainSM<double>::IdxCompare>
               (Nonzero<double> *keys,int end,IdxCompare *compare,int start,bool type)

{
  Nonzero<double> *pNVar1;
  double dVar2;
  int iVar3;
  bool bVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  int *piVar8;
  int start_00;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  ulong uVar12;
  
  uVar9 = (ulong)(uint)start;
  if (start + 1 < end) {
    uVar10 = end - 1;
    uVar12 = (ulong)uVar10;
    uVar6 = uVar10 - start;
    if (0x18 < (int)uVar6) {
LAB_001f9b1f:
      start_00 = (int)uVar9;
      iVar7 = (uVar6 >> 1) + start_00;
      pNVar1 = keys + iVar7;
      iVar7 = keys[iVar7].idx;
      iVar11 = (int)uVar12;
      lVar5 = (long)iVar11;
      lVar19 = (long)start_00;
      uVar15 = uVar12;
      uVar14 = uVar9;
      do {
        iVar17 = (int)uVar14;
        iVar13 = (int)uVar15;
        if ((type & 1U) == 0) {
          if (iVar17 < iVar11) {
            piVar8 = &keys[iVar17].idx;
            lVar18 = 0;
            do {
              bVar4 = EQ(*piVar8,iVar7);
              if ((!bVar4) && (iVar7 <= *piVar8)) {
                uVar14 = (ulong)(uint)(iVar17 - (int)lVar18);
                break;
              }
              lVar18 = lVar18 + -1;
              piVar8 = piVar8 + 4;
              uVar14 = uVar12;
            } while (-lVar5 + (long)iVar17 != lVar18);
          }
          if (start_00 < iVar13) {
            uVar6 = (uint)uVar14;
            uVar14 = (ulong)iVar13;
            piVar8 = &keys[uVar14].idx;
            do {
              bVar4 = EQ(*piVar8,iVar7);
              uVar15 = uVar14;
              if ((bVar4) || (*piVar8 < iVar7)) break;
              uVar14 = uVar14 - 1;
              piVar8 = piVar8 + -4;
              uVar15 = uVar9;
            } while (lVar19 < (long)uVar14);
LAB_001f9cc0:
            uVar14 = (ulong)uVar6;
          }
        }
        else {
          if (iVar17 < iVar11) {
            piVar8 = &keys[iVar17].idx;
            lVar18 = 0;
            do {
              bVar4 = EQ(*piVar8,iVar7);
              if ((bVar4) || (iVar7 <= *piVar8)) {
                uVar14 = (ulong)(uint)(iVar17 - (int)lVar18);
                break;
              }
              lVar18 = lVar18 + -1;
              piVar8 = piVar8 + 4;
              uVar14 = uVar12;
            } while (-lVar5 + (long)iVar17 != lVar18);
          }
          if (start_00 < iVar13) {
            uVar6 = (uint)uVar14;
            uVar14 = (ulong)iVar13;
            piVar8 = &keys[uVar14].idx;
            do {
              bVar4 = EQ(*piVar8,iVar7);
              if ((!bVar4) && (uVar15 = uVar14, *piVar8 < iVar7)) break;
              uVar14 = uVar14 - 1;
              piVar8 = piVar8 + -4;
              uVar15 = uVar9;
            } while (lVar19 < (long)uVar14);
            goto LAB_001f9cc0;
          }
        }
        iVar17 = (int)uVar14;
        iVar13 = (int)uVar15;
        if (iVar13 <= iVar17) goto LAB_001f9d09;
        dVar2 = keys[iVar17].val;
        iVar3 = keys[iVar17].idx;
        keys[iVar17].idx = keys[iVar13].idx;
        keys[iVar17].val = keys[iVar13].val;
        keys[iVar13].val = dVar2;
        keys[iVar13].idx = iVar3;
        uVar14 = (ulong)(iVar17 + 1);
        uVar15 = (ulong)(iVar13 - 1);
      } while( true );
    }
LAB_001f9ea1:
    if (0 < (int)uVar6) {
      SPxShellsort<soplex::Nonzero<double>,soplex::SPxMainSM<double>::IdxCompare>
                (keys,uVar10,compare,start);
      return;
    }
  }
  return;
LAB_001f9d09:
  if ((type & 1U) == 0) {
    if (start_00 < iVar13) {
      uVar16 = (ulong)iVar13;
      piVar8 = &keys[uVar16].idx;
      do {
        bVar4 = EQ(iVar7,*piVar8);
        if ((!bVar4) && (uVar15 = uVar16, *piVar8 <= iVar7)) break;
        uVar16 = uVar16 - 1;
        piVar8 = piVar8 + -4;
        uVar15 = uVar9;
      } while (lVar19 < (long)uVar16);
    }
    if ((int)uVar15 == iVar11) {
      dVar2 = keys[lVar5].val;
      iVar7 = keys[lVar5].idx;
      keys[lVar5].idx = pNVar1->idx;
      keys[lVar5].val = pNVar1->val;
      pNVar1->val = dVar2;
      pNVar1->idx = iVar7;
      uVar15 = (ulong)(iVar11 - 1);
    }
  }
  else {
    if (iVar17 < iVar11) {
      piVar8 = &keys[iVar17].idx;
      lVar18 = 0;
      do {
        bVar4 = EQ(iVar7,*piVar8);
        if ((!bVar4) && (iVar7 < *piVar8)) {
          uVar14 = (ulong)(uint)(iVar17 - (int)lVar18);
          break;
        }
        lVar18 = lVar18 + -1;
        piVar8 = piVar8 + 4;
        uVar14 = uVar12;
      } while (iVar17 - lVar5 != lVar18);
    }
    if ((int)uVar14 == start_00) {
      dVar2 = keys[lVar19].val;
      iVar7 = keys[lVar19].idx;
      keys[lVar19].idx = pNVar1->idx;
      keys[lVar19].val = pNVar1->val;
      pNVar1->val = dVar2;
      pNVar1->idx = iVar7;
      uVar14 = (ulong)(start_00 + 1);
    }
  }
  iVar7 = (int)uVar15;
  uVar6 = iVar7 - start_00;
  iVar13 = (int)uVar14;
  uVar10 = iVar11 - iVar13;
  if ((int)uVar10 < (int)uVar6) {
    uVar12 = uVar15 & 0xffffffff;
    uVar14 = uVar9;
    uVar10 = uVar6;
    iVar7 = iVar11;
    start_00 = iVar13;
    if (iVar11 <= iVar13) goto LAB_001f9e86;
  }
  else {
    uVar9 = uVar14;
    uVar6 = uVar10;
    if (iVar7 <= start_00) goto LAB_001f9e86;
  }
  SPxQuicksort<soplex::Nonzero<double>,soplex::SPxMainSM<double>::IdxCompare>
            (keys,iVar7 + 1,compare,start_00,(bool)(~type & 1));
  uVar9 = uVar14;
  uVar6 = uVar10;
LAB_001f9e86:
  uVar10 = (uint)uVar12;
  start = (int)uVar9;
  type = (bool)(type ^ 1);
  if ((int)uVar6 < 0x19) goto LAB_001f9ea1;
  goto LAB_001f9b1f;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}